

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup.cpp
# Opt level: O2

void __thiscall
QDnsLookup::setNameserver(QDnsLookup *this,Protocol protocol,QHostAddress *nameserver,quint16 port)

{
  Qt::beginPropertyUpdateGroup();
  setNameserver(this,nameserver);
  setNameserverPort(this,port);
  setNameserverProtocol(this,protocol);
  Qt::endPropertyUpdateGroup();
  return;
}

Assistant:

void QDnsLookup::setNameserver(Protocol protocol, const QHostAddress &nameserver, quint16 port)
{
    Qt::beginPropertyUpdateGroup();
    setNameserver(nameserver);
    setNameserverPort(port);
    setNameserverProtocol(protocol);
    Qt::endPropertyUpdateGroup();
}